

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long *plVar6;
  LogMessage *pLVar7;
  bool bVar8;
  int iVar9;
  LogDestination *this_00;
  long lVar10;
  size_t sVar11;
  int i;
  long lVar12;
  ulong uVar13;
  LogMessageData *pLVar14;
  uint severity;
  LogSeverity severity_00;
  ulong uVar15;
  ReaderMutexLock local_50;
  LogMessage *local_48;
  time_t local_40;
  size_t local_38;
  
  sVar11 = this->data_->num_chars_to_log_;
  if ((sVar11 == 0) || (this->data_->message_text_[sVar11 - 1] != '\n')) {
    RawLog__(3,"/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
             ,0x5a0,"Check %s failed: %s",
             "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_-1] == \'\\n\'"
             ,"");
  }
  if ((SendToLog()::already_warned_before_initgoogle == '\0') &&
     (bVar8 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar8)) {
    SendToLog();
  }
  local_48 = this;
  if (fLB::FLAGS_logtostderr == '\x01') {
    pLVar14 = this->data_;
LAB_00113e34:
    ColoredWriteToStderr((int)pLVar14->severity_,pLVar14->message_text_,pLVar14->num_chars_to_log_);
    pLVar14 = this->data_;
    cVar2 = pLVar14->severity_;
    pcVar4 = pLVar14->fullname_;
    pcVar5 = pLVar14->basename_;
    iVar3 = pLVar14->line_;
    uVar13 = pLVar14->num_prefix_chars_;
    sVar11 = pLVar14->num_chars_to_log_;
    local_50.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar9 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar9 != 0))
    goto LAB_0011428c;
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar15 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar15 = uVar15 - 1;
        if ((int)(uint)uVar15 < 0) break;
        plVar6 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar15 & 0x7fffffff) * 8);
        (**(code **)(*plVar6 + 0x10))
                  (plVar6,(int)cVar2,pcVar4,pcVar5,iVar3,&pLVar14->tm_time_,
                   pLVar14->message_text_ + uVar13,~uVar13 + sVar11);
      }
    }
  }
  else {
    bVar8 = glog_internal_namespace_::IsGoogleLoggingInitialized();
    pLVar14 = this->data_;
    if (!bVar8) goto LAB_00113e34;
    bVar1 = pLVar14->severity_;
    severity = (uint)(char)bVar1;
    if (fLB::FLAGS_logtostderr == '\0') {
      if (-1 < (char)bVar1) {
        if (3 < bVar1) {
          __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                        ,0x32d,
                        "static LogDestination *google::LogDestination::log_destination(LogSeverity)"
                       );
        }
        uVar15 = (ulong)severity;
        local_40 = pLVar14->timestamp_;
        lVar12 = 0;
        uVar13 = uVar15;
        local_38 = pLVar14->num_chars_to_log_;
        do {
          iVar3 = fLI::FLAGS_logbuflevel;
          this_00 = (LogDestination *)(&LogDestination::log_destinations_)[uVar15 + lVar12];
          if (this_00 == (LogDestination *)0x0) {
            this_00 = (LogDestination *)operator_new(0xe0);
            iVar9 = severity + (int)lVar12;
            LogDestination::LogDestination(this_00,iVar9,(char *)0x0);
            (&LogDestination::log_destinations_)[uVar15 + lVar12] = this_00;
          }
          else {
            iVar9 = (int)uVar13;
          }
          (*this_00->logger_->_vptr_Logger[2])
                    (this_00->logger_,(ulong)(iVar3 < iVar9),local_40,pLVar14->message_text_,
                     local_38 & 0xffffffff);
          uVar13 = uVar13 - 1;
          lVar10 = uVar15 + lVar12;
          lVar12 = lVar12 + -1;
        } while (lVar10 != 0);
      }
    }
    else {
      ColoredWriteToStderr(severity,pLVar14->message_text_,pLVar14->num_chars_to_log_);
    }
    pLVar7 = local_48;
    pLVar14 = local_48->data_;
    severity_00 = (LogSeverity)pLVar14->severity_;
    sVar11 = pLVar14->num_chars_to_log_;
    if ((fLI::FLAGS_stderrthreshold <= severity_00) || (fLB::FLAGS_alsologtostderr == '\x01')) {
      ColoredWriteToStderr(severity_00,pLVar14->message_text_,sVar11);
      pLVar14 = pLVar7->data_;
      severity_00 = (LogSeverity)pLVar14->severity_;
      sVar11 = pLVar14->num_chars_to_log_;
    }
    LogDestination::MaybeLogToEmail(severity_00,pLVar14->message_text_,sVar11);
    pLVar14 = pLVar7->data_;
    cVar2 = pLVar14->severity_;
    pcVar4 = pLVar14->fullname_;
    pcVar5 = pLVar14->basename_;
    iVar3 = pLVar14->line_;
    uVar13 = pLVar14->num_prefix_chars_;
    sVar11 = pLVar14->num_chars_to_log_;
    local_50.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar9 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar9 != 0))
    {
      abort();
    }
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar15 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar15 = uVar15 - 1;
        if ((int)(uint)uVar15 < 0) break;
        plVar6 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar15 & 0x7fffffff) * 8);
        (**(code **)(*plVar6 + 0x10))
                  (plVar6,(int)cVar2,pcVar4,pcVar5,iVar3,&pLVar14->tm_time_,
                   pLVar14->message_text_ + uVar13,~uVar13 + sVar11);
      }
    }
  }
  ::glog_internal_namespace_::ReaderMutexLock::~ReaderMutexLock(&local_50);
  pLVar7 = local_48;
  if ((local_48->data_->severity_ != '\x03') || (exit_on_dfatal != '\x01')) {
    return;
  }
  if (local_48->data_->first_fatal_ == true) {
    crash_reason._0_8_ = fatal_msg_data_exclusive._30488_8_;
    crash_reason._8_4_ = fatal_msg_data_exclusive._30364_4_;
    crash_reason._16_8_ = fatal_msg_data_exclusive._30456_8_ + 0x134ba4;
    crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,4);
    glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
    iVar3 = (int)pLVar7->data_->num_chars_to_log_;
    iVar9 = 0xff;
    if (iVar3 < 0xff) {
      iVar9 = iVar3;
    }
    memcpy(&fatal_message,pLVar7->data_->message_text_,(long)iVar9);
    (&fatal_message)[iVar9] = 0;
    fatal_time = pLVar7->data_->timestamp_;
  }
  if (fLB::FLAGS_logtostderr == '\0') {
    lVar12 = 0;
    do {
      if ((&LogDestination::log_destinations_)[lVar12] != 0) {
        plVar6 = *(long **)((&LogDestination::log_destinations_)[lVar12] + 0xd8);
        (**(code **)(*plVar6 + 0x10))(plVar6,1,0,"",0);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
  LogDestination::WaitForSinks(pLVar7->data_);
  write(2,"*** Check failure stack trace: ***\n",0x23);
  (*(code *)g_logging_fail_func)();
LAB_0011428c:
  abort();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  log_mutex.AssertHeld();

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
             data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] = "WARNING: Logging before InitGoogleLogging() is "
                     "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || !IsGoogleLoggingInitialized()) {
    ColoredWriteToStderr(data_->severity_,
                         data_->message_text_, data_->num_chars_to_log_);

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_ -
                                data_->num_prefix_chars_ - 1));
  } else {

    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, data_->timestamp_,
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_
                                - data_->num_prefix_chars_ - 1));
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const int copy = min<int>(data_->num_chars_to_log_,
                                sizeof(fatal_message)-1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = data_->timestamp_;
    }

    if (!FLAGS_logtostderr) {
      for (int i = 0; i < NUM_SEVERITIES; ++i) {
        if ( LogDestination::log_destinations_[i] )
          LogDestination::log_destinations_[i]->logger_->Write(true, 0, "", 0);
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.Unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    Fail();
  }
}